

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic&>
          (SmallVectorBase<slang::Diagnostic> *this,Diagnostic *args)

{
  pointer pDVar1;
  reference pDVar2;
  
  if (this->len == this->cap) {
    pDVar1 = emplaceRealloc<slang::Diagnostic&>(this,this->data_ + this->len,args);
    return pDVar1;
  }
  Diagnostic::Diagnostic(this->data_ + this->len,args);
  this->len = this->len + 1;
  pDVar2 = back(this);
  return pDVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }